

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O2

void __thiscall
baryonyx::itm::default_cost_type<double>::make_l2_norm(default_cost_type<double> *this,int n)

{
  double *pdVar1;
  int i;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  pdVar1 = (this->linear_elements)._M_t.
           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
           super__Head_base<0UL,_double_*,_false>._M_head_impl;
  auVar3 = ZEXT816(0) << 0x40;
  uVar2 = 0;
  while ((uint)n != uVar2) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = pdVar1[uVar2];
    uVar2 = uVar2 + 1;
    auVar3 = vfmadd231sd_fma(auVar3,auVar4,auVar4);
  }
  if ((uint)((long)ABS(auVar3._0_8_) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
    for (uVar2 = 0; (uint)n != uVar2; uVar2 = uVar2 + 1) {
      pdVar1[uVar2] = pdVar1[uVar2] / auVar3._0_8_;
    }
  }
  return;
}

Assistant:

void make_l2_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += linear_elements[i] * linear_elements[i];

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }